

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O2

size_t InsertInt(FILE *f,uint data)

{
  size_t sVar1;
  uchar buf [4];
  
  sVar1 = fwrite(buf,1,2,(FILE *)f);
  return sVar1;
}

Assistant:

size_t InsertInt(FILE* f, unsigned int data)
{
   unsigned char buf[4];
   buf[3] = (data & 0xFF);
   buf[2] = ((data >> 8) & 0xFF);
   buf[1] = ((data >> 16) & 0xFF);
   buf[0] = ((data >> 24) & 0xFF);
   return fwrite(buf, 1, 2, f);
}